

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O1

void BuilderTests<TestHeapBuilder,_TestHeapBuilder>::builder_move_assign_before_finish_test(void)

{
  bool val;
  Offset<MyGame::Example::Monster> root;
  TestHeapBuilder dst;
  TestHeapBuilder src;
  string local_130;
  FlatBufferBuilder local_110;
  FlatBufferBuilder local_90;
  
  local_90.buf_.allocator_ = (Allocator *)operator_new(8);
  (local_90.buf_.allocator_)->_vptr_Allocator = (_func_int **)&PTR__Allocator_00201c00;
  local_90.buf_.own_allocator_ = true;
  local_90.buf_.initial_size_ = 0x800;
  local_90.buf_.max_size_ = 0x7fffffff;
  local_90.buf_.buffer_minalign_ = 8;
  local_90.buf_.reserved_ = 0;
  local_90.buf_.size_ = 0;
  local_90.length_of_64_bit_region_ = 0;
  local_90.nested = false;
  local_90.finished = false;
  local_90.buf_.scratch_._0_6_ = 0;
  local_90._78_8_ = 0;
  local_90.buf_.buf_ = (uint8_t *)0x0;
  local_90.buf_.cur_._0_6_ = 0;
  local_90.buf_.cur_._6_2_ = 0;
  local_90.minalign_ = 1;
  local_90.force_defaults_ = false;
  local_90.dedup_vtables_ = true;
  local_90.string_pool = (StringOffsetMap *)0x0;
  root = populate1(&local_90);
  local_110.buf_.allocator_ = (Allocator *)operator_new(8);
  (local_110.buf_.allocator_)->_vptr_Allocator = (_func_int **)&PTR__Allocator_00201c00;
  local_110.buf_.own_allocator_ = true;
  local_110.buf_.initial_size_ = 0x800;
  local_110.buf_.max_size_ = 0x7fffffff;
  local_110.buf_.buffer_minalign_ = 8;
  local_110.buf_.reserved_ = 0;
  local_110.buf_.size_ = 0;
  local_110.length_of_64_bit_region_ = 0;
  local_110.nested = false;
  local_110.finished = false;
  local_110.buf_.buf_ = (uint8_t *)0x0;
  local_110.buf_.cur_._0_6_ = 0;
  local_110.buf_.cur_._6_2_ = 0;
  local_110.buf_.scratch_._0_6_ = 0;
  local_110._78_8_ = 0;
  local_110.minalign_ = 1;
  local_110.force_defaults_ = false;
  local_110.dedup_vtables_ = true;
  local_110.string_pool = (StringOffsetMap *)0x0;
  populate2(&local_110);
  flatbuffers::FlatBufferBuilderImpl<false>::operator=(&local_110,&local_90);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish(&local_110,root.o,(char *)0x0,false);
  local_130.field_2._M_allocated_capacity = 0x6d65647265627943;
  local_130.field_2._8_2_ = 0x6e6f;
  local_130._M_string_length = 10;
  local_130.field_2._M_local_buf[10] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  val = release_n_verify(&local_110,&local_130,Color_Red);
  TestEq<bool,bool>(true,val,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                    ,0x7f,
                    "static void BuilderTests<TestHeapBuilder>::builder_move_assign_before_finish_test() [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                   );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  TestEq<unsigned_int,int>
            (local_90.buf_.size_,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x80,
             "static void BuilderTests<TestHeapBuilder>::builder_move_assign_before_finish_test() [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
            );
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_110);
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_90);
  return;
}

Assistant:

inline std::string m1_name() { return "Cyberdemon"; }